

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderSpectatorNotification(CHud *this)

{
  CGameClient *pCVar1;
  IGraphics *pIVar2;
  ITextRender *pIVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  
  pCVar1 = (this->super_CComponent).m_pClient;
  if ((((long)pCVar1->m_LocalClientID != -1) &&
      (pCVar1->m_aClients[pCVar1->m_LocalClientID].m_Team == -1)) &&
     (pCVar1->m_pClient->m_LocalTime <= pCVar1->m_TeamChangeTime + 5.0)) {
    iVar5 = 0;
    for (lVar6 = 0x4aec; lVar6 != 0x1b6ec; lVar6 = lVar6 + 0x5b0) {
      if (*(char *)((long)(pCVar1->m_All).m_paComponents + lVar6 + -0x10) == '\x01') {
        iVar5 = iVar5 + (uint)(*(int *)((long)pCVar1 + lVar6 + -0x2a4) != -1);
      }
    }
    if (0 < iVar5) {
      pcVar4 = Localize("Click on a player or a flag to follow it","");
      if (RenderSpectatorNotification()::s_Cursor == '\0') {
        iVar5 = __cxa_guard_acquire(&RenderSpectatorNotification()::s_Cursor);
        if (iVar5 != 0) {
          CTextCursor::CTextCursor(&RenderSpectatorNotification::s_Cursor,16.0,0);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderSpectatorNotification::s_Cursor,
                       &__dso_handle);
          __cxa_guard_release(&RenderSpectatorNotification()::s_Cursor);
        }
      }
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      RenderSpectatorNotification::s_Cursor.m_CursorPos.field_0.x =
           ((float)pIVar2->m_ScreenWidth / (float)pIVar2->m_ScreenHeight) * 150.0;
      RenderSpectatorNotification::s_Cursor.m_CursorPos.field_1.y = 30.0;
      RenderSpectatorNotification::s_Cursor.m_Align = 1;
      CTextCursor::Reset(&RenderSpectatorNotification::s_Cursor,
                         (long)g_Localization.m_CurrentVersion);
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
                (pIVar3,&RenderSpectatorNotification::s_Cursor,pcVar4,0xffffffffffffffff);
      return;
    }
  }
  return;
}

Assistant:

void CHud::RenderSpectatorNotification()
{
	if(m_pClient->m_LocalClientID != -1
		&& m_pClient->m_aClients[m_pClient->m_LocalClientID].m_Team == TEAM_SPECTATORS
		&& m_pClient->m_TeamChangeTime + 5.0f >= Client()->LocalTime())
	{
		// count non spectators
		int NumPlayers = 0;
		for(int i = 0; i < MAX_CLIENTS; i++)
			if(m_pClient->m_aClients[i].m_Active && m_pClient->m_aClients[i].m_Team != TEAM_SPECTATORS)
				NumPlayers++;
		
		if(NumPlayers > 0)
		{
			const char *pText = Localize("Click on a player or a flag to follow it");
			static CTextCursor s_Cursor(16.0f);
			s_Cursor.MoveTo(150 * Graphics()->ScreenAspect(), 30);
			s_Cursor.m_Align = TEXTALIGN_TC;
			s_Cursor.Reset(g_Localization.Version());
			TextRender()->TextOutlined(&s_Cursor, pText, -1);
		}
	}
}